

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_callstack.c
# Opt level: O1

HT_ErrorCode HT_FeatureCallstack_register(void)

{
  HT_ErrorCode HVar1;
  
  HVar1 = ht_registry_register_feature
                    ((HT_FeatureKlass *)HT_FeatureCallstack_get_class_feature_klass);
  return HVar1;
}

Assistant:

static HT_Feature*
ht_feature_callstack_create(HT_ErrorCode* out_err)
{
    HT_FeatureCallstack* feature = HT_FeatureCallstack_alloc();
    HT_ErrorCode error_code = HT_ERR_OK;

    if (feature == NULL)
    {
        HT_SET_ERROR(out_err, HT_ERR_OUT_OF_MEMORY);
        return NULL;
    }

    error_code = ht_stack_init(&feature->stack, 1024, 32);

    if (error_code != HT_ERR_OK)
    {
        ht_free(feature);
        feature = NULL;
    }

    HT_SET_ERROR(out_err, error_code);

    return (HT_Feature*)feature;
}